

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

int __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_>::SideIsUndefined
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_> *this,int side)

{
  int iVar1;
  ostream *this_00;
  void *this_01;
  int in_ESI;
  long *in_RDI;
  size_t in_stack_000003f8;
  char *in_stack_00000400;
  
  if (-1 < in_ESI) {
    iVar1 = (**(code **)(*in_RDI + 0xf0))();
    if (in_ESI <= iVar1) goto LAB_0166f84d;
  }
  this_00 = std::operator<<((ostream *)&std::cerr,
                            "TPZGeoElRefLess<TGeo>::SideIsUndefined - bad side: ");
  this_01 = (void *)std::ostream::operator<<(this_00,in_ESI);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  pzinternal::DebugStopImpl(in_stack_00000400,in_stack_000003f8);
LAB_0166f84d:
  iVar1 = TPZGeoElSideIndex::Side((TPZGeoElSideIndex *)(in_RDI + (long)in_ESI * 3 + 0x42));
  return (int)(iVar1 == -1);
}

Assistant:

int
TPZGeoElRefLess<TGeo>::SideIsUndefined(int side){
	if (side < 0 || side > NSides()){
		PZError << "TPZGeoElRefLess<TGeo>::SideIsUndefined - bad side: " << side << std::endl;
        DebugStop();
	}
	return (fNeighbours[side].Side() == -1);
}